

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_arc.cpp
# Opt level: O1

void __thiscall agg::arc::normalize(arc *this,double a1,double a2,bool ccw)

{
  undefined3 in_register_00000031;
  double dVar1;
  
  dVar1 = (ABS(this->m_ry) + ABS(this->m_rx)) * 0.5;
  dVar1 = acos(dVar1 / (0.125 / this->m_scale + dVar1));
  this->m_da = dVar1 + dVar1;
  if (CONCAT31(in_register_00000031,ccw) == 0) {
    if (a1 < a2) {
      do {
        a1 = a1 + 6.283185307179586;
      } while (a1 < a2);
    }
    this->m_da = -(dVar1 + dVar1);
  }
  else if (a2 < a1) {
    do {
      a2 = a2 + 6.283185307179586;
    } while (a2 < a1);
  }
  this->m_ccw = ccw;
  this->m_start = a1;
  this->m_end = a2;
  this->m_initialized = true;
  return;
}

Assistant:

void arc::normalize(double a1, double a2, bool ccw)
    {
        double ra = (fabs(m_rx) + fabs(m_ry)) / 2;
        m_da = acos(ra / (ra + 0.125 / m_scale)) * 2;
        if(ccw)
        {
            while(a2 < a1) a2 += pi * 2.0;
        }
        else
        {
            while(a1 < a2) a1 += pi * 2.0;
            m_da = -m_da;
        }
        m_ccw   = ccw;
        m_start = a1;
        m_end   = a2;
        m_initialized = true;
    }